

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall Image::saveToPPM(Image *this,char *filename)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  float fVar6;
  ofstream ofs;
  char local_23d;
  int local_23c;
  float local_238;
  float local_234;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"P6\n",3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_230,this->width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n255\n",5);
  iVar5 = this->height;
  if (0 < iVar5) {
    pfVar4 = this->imageData;
    iVar1 = this->width;
    iVar3 = 0;
    do {
      if (0 < iVar1) {
        iVar5 = 0;
        local_23c = iVar3;
        do {
          fVar6 = powf(*pfVar4,0.45454547);
          fVar6 = fVar6 * 255.0 + 0.5;
          if (255.0 <= fVar6) {
            fVar6 = 255.0;
          }
          if (fVar6 <= 0.0) {
            fVar6 = 0.0;
          }
          local_234 = powf(pfVar4[1],0.45454547);
          local_238 = powf(pfVar4[2],0.45454547);
          local_23d = (char)(int)fVar6;
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,&local_23d,1);
          fVar6 = local_234 * 255.0 + 0.5;
          if (255.0 <= fVar6) {
            fVar6 = 255.0;
          }
          if (fVar6 <= 0.0) {
            fVar6 = 0.0;
          }
          local_23d = (char)(int)fVar6;
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_23d,1);
          fVar6 = local_238 * 255.0 + 0.5;
          if (255.0 <= fVar6) {
            fVar6 = 255.0;
          }
          if (fVar6 <= 0.0) {
            fVar6 = 0.0;
          }
          local_23d = (char)(int)fVar6;
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_23d,1);
          pfVar4 = pfVar4 + 3;
          iVar5 = iVar5 + 1;
          iVar1 = this->width;
        } while (iVar5 < iVar1);
        iVar5 = this->height;
        iVar3 = local_23c;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < iVar5);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sinf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Image::saveToPPM(const char *filename) {
    std::ofstream ofs;
        ofs.open(filename);
        ofs << "P6\n" << width << " " << height << "\n255\n";
        float *pixel = imageData;
        for (int j = 0; j < height; ++j) {
            for (int i = 0; i < width; ++i) {
                unsigned char r = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[0], 1/2.2) * 255 + 0.5f)));
                unsigned char g = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[1], 1/2.2) * 255 + 0.5f)));
                unsigned char b = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[2], 1/2.2) * 255 + 0.5f)));
                ofs << r << g << b;
                pixel += 3;
            }
        }
        ofs.close();
}